

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# part_attr.c
# Opt level: O0

exr_result_t
exr_set_tile_descriptor
          (exr_context_t ctxt,int part_index,uint32_t x_size,uint32_t y_size,
          exr_tile_level_mode_t level_mode,exr_tile_round_mode_t round_mode)

{
  _internal_exr_part *p_Var1;
  exr_attribute_t *peVar2;
  exr_result_t eVar3;
  int in_ECX;
  int in_EDX;
  uint in_ESI;
  _internal_exr_context *in_RDI;
  byte in_R8B;
  char in_R9B;
  int32_t unaff_retaddr;
  exr_attribute_type_t unaff_retaddr_00;
  _internal_exr_part *part;
  _internal_exr_context *pctxt;
  exr_attribute_t *attr;
  exr_result_t rv;
  int in_stack_0000004c;
  _internal_exr_part *in_stack_00000050;
  _internal_exr_context *in_stack_00000058;
  int local_28;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  local_28 = 0;
  if (in_RDI == (_internal_exr_context *)0x0) {
    local_28 = 2;
  }
  else {
    internal_exr_lock(in_RDI);
    if (((int)in_ESI < 0) || (in_RDI->num_parts <= (int)in_ESI)) {
      internal_exr_unlock(in_RDI);
      local_28 = (*in_RDI->print_error)(in_RDI,4,"Part index (%d) out of range",(ulong)in_ESI);
    }
    else {
      p_Var1 = in_RDI->parts[(int)in_ESI];
      if (in_RDI->mode == '\0') {
        internal_exr_unlock(in_RDI);
        local_28 = (*in_RDI->standard_error)(in_RDI,8);
      }
      else if (in_RDI->mode == '\x03') {
        internal_exr_unlock(in_RDI);
        local_28 = (*in_RDI->standard_error)(in_RDI,0x15);
      }
      else if ((p_Var1->storage_mode == EXR_STORAGE_SCANLINE) ||
              (p_Var1->storage_mode == EXR_STORAGE_DEEP_SCANLINE)) {
        internal_exr_unlock(in_RDI);
        local_28 = (*in_RDI->report_error)
                             (in_RDI,0x13,"Attempt to set tile descriptor on scanline part");
      }
      else {
        if (p_Var1->tiles == (exr_attribute_t *)0x0) {
          local_28 = exr_attr_list_add((exr_context_t)attr,(exr_attribute_list_t *)pctxt,
                                       (char *)part,unaff_retaddr_00,unaff_retaddr,
                                       (uint8_t **)
                                       CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8)
                                       ,(exr_attribute_t **)CONCAT44(part_index,x_size));
        }
        else if (p_Var1->tiles->type != EXR_ATTR_TILEDESC) {
          internal_exr_unlock(in_RDI);
          eVar3 = (*in_RDI->print_error)
                            (in_RDI,6,"Invalid required attribute type \'%s\' for \'%s\'",
                             p_Var1->tiles->type_name,"tiles");
          return eVar3;
        }
        peVar2 = p_Var1->tiles;
        if (local_28 == 0) {
          ((peVar2->field_6).chlist)->num_channels = in_EDX;
          ((peVar2->field_6).chlist)->num_alloced = in_ECX;
          ((peVar2->field_6).tiledesc)->level_and_round = in_R9B << 4 | in_R8B & 0xf;
          local_28 = internal_exr_compute_tile_information
                               (in_stack_00000058,in_stack_00000050,in_stack_0000004c);
        }
        internal_exr_unlock(in_RDI);
      }
    }
  }
  return local_28;
}

Assistant:

exr_result_t
exr_set_tile_descriptor (
    exr_context_t         ctxt,
    int                   part_index,
    uint32_t              x_size,
    uint32_t              y_size,
    exr_tile_level_mode_t level_mode,
    exr_tile_round_mode_t round_mode)
{
    exr_result_t     rv   = EXR_ERR_SUCCESS;
    exr_attribute_t* attr = NULL;
    EXR_PROMOTE_LOCKED_CONTEXT_AND_PART_OR_ERROR (ctxt, part_index);
    if (pctxt->mode == EXR_CONTEXT_READ)
        return EXR_UNLOCK_AND_RETURN_PCTXT (
            pctxt->standard_error (pctxt, EXR_ERR_NOT_OPEN_WRITE));
    if (pctxt->mode == EXR_CONTEXT_WRITING_DATA)
        return EXR_UNLOCK_AND_RETURN_PCTXT (
            pctxt->standard_error (pctxt, EXR_ERR_ALREADY_WROTE_ATTRS));
    if (part->storage_mode == EXR_STORAGE_SCANLINE ||
        part->storage_mode == EXR_STORAGE_DEEP_SCANLINE)
        return EXR_UNLOCK_AND_RETURN_PCTXT (pctxt->report_error (
            pctxt,
            EXR_ERR_TILE_SCAN_MIXEDAPI,
            "Attempt to set tile descriptor on scanline part"));

    if (!part->tiles)
    {
        rv = exr_attr_list_add (
            ctxt,
            &(part->attributes),
            "tiles",
            EXR_ATTR_TILEDESC,
            0,
            NULL,
            &(part->tiles));
    }
    else if (part->tiles->type != EXR_ATTR_TILEDESC)
    {
        return EXR_UNLOCK_AND_RETURN_PCTXT (pctxt->print_error (
            pctxt,
            EXR_ERR_FILE_BAD_HEADER,
            "Invalid required attribute type '%s' for '%s'",
            part->tiles->type_name,
            "tiles"));
    }

    attr = part->tiles;

    if (rv == EXR_ERR_SUCCESS)
    {
        attr->tiledesc->x_size = x_size;
        attr->tiledesc->y_size = y_size;
        attr->tiledesc->level_and_round =
            EXR_PACK_TILE_LEVEL_ROUND (level_mode, round_mode);

        rv = internal_exr_compute_tile_information (pctxt, part, 1);
    }

    return EXR_UNLOCK_AND_RETURN_PCTXT (rv);
}